

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrint.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::CoreMLModels::VisionFeaturePrint_Scene::VisionFeaturePrint_Scene
          (VisionFeaturePrint_Scene *this,VisionFeaturePrint_Scene *from)

{
  ulong uVar1;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__VisionFeaturePrint_Scene_004bc590;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  this->version_ = from->version_;
  return;
}

Assistant:

VisionFeaturePrint_Scene::VisionFeaturePrint_Scene(const VisionFeaturePrint_Scene& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  version_ = from.version_;
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.CoreMLModels.VisionFeaturePrint.Scene)
}